

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

int __thiscall cs_impl::any::holder<int>::kill(holder<int> *this,__pid_t __pid,int __sig)

{
  int extraout_EAX;
  
  cs::allocator_type<cs_impl::any::holder<int>,_64UL,_cs_impl::default_allocator_provider>::free
            ((allocator_type<cs_impl::any::holder<int>,_64UL,_cs_impl::default_allocator_provider> *
             )allocator,this);
  return extraout_EAX;
}

Assistant:

void kill() override
			{
				allocator.free(this);
			}